

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

sqlite3_int64 sqlite3_memory_highwater(int resetFlag)

{
  sqlite3_int64 mx;
  sqlite3_int64 res;
  sqlite3_int64 local_18;
  sqlite3_int64 local_10;
  
  sqlite3_status64(0,&local_10,&local_18,resetFlag);
  return local_18;
}

Assistant:

SQLITE_API sqlite3_int64 sqlite3_memory_highwater(int resetFlag){
  sqlite3_int64 res, mx;
  sqlite3_status64(SQLITE_STATUS_MEMORY_USED, &res, &mx, resetFlag);
  return mx;
}